

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxpool.h
# Opt level: O0

int __thiscall cxxpool::thread_pool::shutdown(thread_pool *this,int __fd,int __how)

{
  bool bVar1;
  int extraout_EAX;
  thread *thread;
  iterator __end2;
  iterator __begin2;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  lock_guard<std::mutex> thread_lock;
  lock_guard<std::mutex> task_lock;
  thread_pool *this_local;
  
  std::lock_guard<std::mutex>::lock_guard(&thread_lock,&this->task_mutex_);
  this->done_ = true;
  this->paused_ = false;
  std::lock_guard<std::mutex>::~lock_guard(&thread_lock);
  std::condition_variable::notify_all();
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&__range2,&this->thread_mutex_);
  __end2 = std::vector<std::thread,_std::allocator<std::thread>_>::begin(&this->threads_);
  thread = (thread *)std::vector<std::thread,_std::allocator<std::thread>_>::end(&this->threads_);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                *)&thread);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator*(&__end2);
    std::thread::join();
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end2);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&__range2);
  return extraout_EAX;
}

Assistant:

void shutdown() {
        {
            std::lock_guard<std::mutex> task_lock(task_mutex_);
            done_ = true;
            paused_ = false;
        }
        task_cond_var_.notify_all();
        std::lock_guard<std::mutex> thread_lock(thread_mutex_);
        for (auto& thread : threads_)
            thread.join();
    }